

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

void Saig_ManCexMinCollectReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vReason,int fPiReason)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar6;
  uint uVar7;
  uint uVar8;
  
  iVar3 = p->nTravIds;
  if (pObj->TravId != iVar3) {
    do {
      pObj->TravId = iVar3;
      uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar5 = uVar4 & 7;
      if (uVar5 == 3) {
        pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      }
      else {
        if (uVar5 == 2) {
          iVar3 = (pObj->field_0).CioId;
          iVar2 = p->nTruePis;
          if (fPiReason == 0) {
            if (iVar3 < iVar2) {
              return;
            }
            uVar4 = (pObj->field_5).iData;
            if (-1 < (int)uVar4) {
              iVar3 = iVar3 - iVar2;
              goto joined_r0x005811a2;
            }
          }
          else {
            if (iVar2 <= iVar3) {
              return;
            }
            uVar4 = (pObj->field_5).iData;
            if (-1 < (int)uVar4) {
joined_r0x005811a2:
              if (-1 < iVar3) {
                Vec_IntPush(vReason,(uVar4 & 1) + iVar3 * 2 ^ 1);
                return;
              }
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
          }
LAB_005811c3:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if (((ulong)pObj & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
        }
        if (uVar5 == 1) {
          return;
        }
        if ((uVar4 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                        ,0x180,
                        "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                       );
        }
        if ((pObj->field_5).iData < 0) goto LAB_005811c3;
        pObj_00 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
        uVar4 = (pObj_00->field_5).iData;
        uVar5 = (uint)pObj->pFanin0;
        if (((pObj->field_5).iData & 1U) == 0) {
          if ((int)uVar4 < 0) goto LAB_005811c3;
          pAVar6 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
          uVar1 = (pAVar6->field_5).iData;
          if ((int)uVar1 < 0) goto LAB_005811c3;
          uVar8 = uVar4 & 1;
          uVar5 = uVar5 & 1;
          uVar7 = ((uint)pObj->pFanin1 ^ uVar1) & 1;
          if ((uVar8 != uVar5) && (uVar7 != 0)) {
            __assert_fail("!fPhase0 || !fPhase1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                          ,0x18d,
                          "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          if ((((uVar8 != uVar5) || (pObj = pObj_00, uVar7 == 0)) &&
              ((uVar8 == uVar5 || (pObj = pAVar6, uVar7 != 0)))) &&
             (pObj = pObj_00, uVar4 >> 1 < uVar1 >> 1)) {
            pObj = pAVar6;
          }
        }
        else {
          if ((int)uVar4 < 0) goto LAB_005811c3;
          uVar1 = *(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28);
          if ((int)uVar1 < 0) goto LAB_005811c3;
          if (((uVar1 ^ (uint)pObj->pFanin1) & (uVar4 ^ uVar5) & 1) == 0) {
            __assert_fail("fPhase0 && fPhase1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                          ,0x185,
                          "void Saig_ManCexMinCollectReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          Saig_ManCexMinCollectReason_rec(p,pObj_00,vReason,fPiReason);
          iVar3 = p->nTravIds;
          pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        }
      }
    } while (pObj->TravId != iVar3);
  }
  return;
}

Assistant:

void Saig_ManCexMinCollectReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vReason, int fPiReason )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( fPiReason && Saig_ObjIsPi(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Aig_ObjCioId(pObj), !Abc_LitIsCompl(pObj->iData) ) );
        else if ( !fPiReason && Saig_ObjIsLo(p, pObj) )
            Vec_IntPush( vReason, Abc_Var2Lit( Saig_ObjRegId(p, pObj), !Abc_LitIsCompl(pObj->iData) ) );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    if ( Abc_LitIsCompl(pObj->iData) ) // value 1
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( fPhase0 && fPhase1 );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
    }
    else
    {
        int fPhase0 = Abc_LitIsCompl( Aig_ObjFanin0(pObj)->iData ) ^ Aig_ObjFaninC0(pObj);
        int fPhase1 = Abc_LitIsCompl( Aig_ObjFanin1(pObj)->iData ) ^ Aig_ObjFaninC1(pObj);
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
        else if ( fPhase0 && !fPhase1 )
            Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        else 
        {
            int iPrio0 = Abc_Lit2Var( Aig_ObjFanin0(pObj)->iData );
            int iPrio1 = Abc_Lit2Var( Aig_ObjFanin1(pObj)->iData );
            if ( iPrio0 >= iPrio1 )
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin0(pObj), vReason, fPiReason );
            else
                Saig_ManCexMinCollectReason_rec( p, Aig_ObjFanin1(pObj), vReason, fPiReason );
        }
    }
}